

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-random.c
# Opt level: O0

void random_cb(uv_random_t *req,int status,void *buf,size_t buflen)

{
  int iVar1;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  void *eval_b_1;
  void *eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  char zero [256];
  size_t buflen_local;
  void *buf_local;
  int status_local;
  uv_random_t *req_local;
  
  memset(&eval_a,0,0x100);
  if ((long)status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-random.c"
            ,0x24,"status","==","0",(long)status,"==",0);
    abort();
  }
  if ((char *)buf != scratch) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-random.c"
            ,0x25,"buf","==","(void*) scratch",buf,"==",scratch);
    abort();
  }
  if (random_cb_called == 0) {
    if (buflen != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-random.c"
              ,0x28,"buflen","==","0",buflen,"==",0);
      abort();
    }
    iVar1 = memcmp(scratch,&eval_a,0x100);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-random.c"
              ,0x29,"memcmp(scratch, zero, sizeof(zero))","==","0",(long)iVar1,"==",0);
      abort();
    }
  }
  else {
    if (buflen != 0x100) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-random.c"
              ,0x2b,"buflen","==","sizeof(scratch)",buflen,"==",0x100);
      abort();
    }
    iVar1 = memcmp(scratch,&eval_a,0x100);
    if (iVar1 == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-random.c"
              ,0x2d,"0","!=","memcmp(scratch, zero, sizeof(zero))",0,"!=",0);
      abort();
    }
  }
  random_cb_called = random_cb_called + 1;
  return;
}

Assistant:

static void random_cb(uv_random_t* req, int status, void* buf, size_t buflen) {
  char zero[sizeof(scratch)];

  memset(zero, 0, sizeof(zero));

  ASSERT_OK(status);
  ASSERT_PTR_EQ(buf, (void*) scratch);

  if (random_cb_called == 0) {
    ASSERT_OK(buflen);
    ASSERT_OK(memcmp(scratch, zero, sizeof(zero)));
  } else {
    ASSERT_EQ(buflen, sizeof(scratch));
    /* Buy a lottery ticket if you manage to trip this assertion. */
    ASSERT_NE(0, memcmp(scratch, zero, sizeof(zero)));
  }

  random_cb_called++;
}